

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context_tree.c
# Opt level: O3

int av1_setup_sms_tree(AV1_COMP *cpi,ThreadData_conflict *td)

{
  undefined8 *puVar1;
  BLOCK_SIZE BVar2;
  SIMPLE_MOTION_DATA_TREE *pSVar3;
  SIMPLE_MOTION_DATA_TREE *tree_1;
  SIMPLE_MOTION_DATA_TREE *pSVar4;
  SIMPLE_MOTION_DATA_TREE *pSVar5;
  uint uVar6;
  ulong uVar7;
  long lVar9;
  int iVar10;
  long lVar11;
  size_t num;
  bool bVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  ulong uVar8;
  
  if ((cpi->oxcf).kf_cfg.key_freq_max == 0) {
    return 0;
  }
  if ((cpi->oxcf).pass == AOM_RC_FIRST_PASS) {
    bVar12 = false;
  }
  else {
    bVar12 = cpi->compressor_stage != '\x01';
  }
  BVar2 = ((cpi->common).seq_params)->sb_size;
  aom_free(td->sms_tree);
  num = 1;
  if (bVar12) {
    num = (ulong)(BVar2 == BLOCK_128X128) << 10 | 0x155;
  }
  pSVar4 = (SIMPLE_MOTION_DATA_TREE *)aom_calloc(num,0x78);
  td->sms_tree = pSVar4;
  if (pSVar4 == (SIMPLE_MOTION_DATA_TREE *)0x0) {
    iVar10 = -1;
  }
  else {
    if (bVar12) {
      uVar7 = 0x100;
      pSVar5 = pSVar4;
      uVar8 = uVar7;
      if (BVar2 == BLOCK_128X128) {
        uVar7 = 0x400;
        uVar8 = uVar7;
      }
      do {
        pSVar5->block_size = BLOCK_4X4;
        uVar7 = uVar7 - 1;
        pSVar5 = pSVar5 + 1;
      } while (uVar7 != 0);
      lVar9 = 1;
      uVar7 = uVar8;
      do {
        uVar6 = (uint)uVar8;
        if (uVar6 < 4) break;
        uVar8 = uVar8 >> 2;
        BVar2 = square[lVar9];
        lVar11 = uVar7 * 0x78;
        iVar10 = 0;
        pSVar5 = pSVar4;
        do {
          pSVar3 = td->sms_tree;
          *(BLOCK_SIZE *)((long)pSVar3->split + lVar11 + -8) = BVar2;
          pSVar4 = pSVar5 + 4;
          auVar13._8_4_ = (int)pSVar5;
          auVar13._0_8_ = pSVar5;
          auVar13._12_4_ = (int)((ulong)pSVar5 >> 0x20);
          puVar1 = (undefined8 *)((long)pSVar3->split + lVar11);
          *puVar1 = pSVar5;
          puVar1[1] = auVar13._8_8_ + 0x78;
          pSVar5 = pSVar5 + 2;
          auVar14._8_4_ = (int)pSVar5;
          auVar14._0_8_ = pSVar5;
          auVar14._12_4_ = (int)((ulong)pSVar5 >> 0x20);
          puVar1 = (undefined8 *)((long)pSVar3->split + lVar11 + 0x10);
          *puVar1 = pSVar5;
          puVar1[1] = auVar14._8_8_ + 0x78;
          lVar11 = lVar11 + 0x78;
          iVar10 = iVar10 + -1;
          pSVar5 = pSVar4;
        } while (-(int)uVar8 != iVar10);
        uVar7 = (ulong)(uint)((int)uVar7 - iVar10);
        lVar9 = lVar9 + 1;
      } while (0xf < uVar6);
      pSVar4 = td->sms_tree;
    }
    else {
      pSVar4->block_size = BLOCK_16X16;
    }
    td->sms_root = pSVar4 + (num - 1);
    iVar10 = 0;
  }
  return iVar10;
}

Assistant:

int av1_setup_sms_tree(AV1_COMP *const cpi, ThreadData *td) {
  // The structure 'sms_tree' is used to store the simple motion search data for
  // partition pruning in inter frames. Hence, the memory allocations and
  // initializations related to it are avoided for allintra encoding mode.
  if (cpi->oxcf.kf_cfg.key_freq_max == 0) return 0;

  AV1_COMMON *const cm = &cpi->common;
  const int stat_generation_stage = is_stat_generation_stage(cpi);
  const int is_sb_size_128 = cm->seq_params->sb_size == BLOCK_128X128;
  const int tree_nodes =
      av1_get_pc_tree_nodes(is_sb_size_128, stat_generation_stage);
  int sms_tree_index = 0;
  SIMPLE_MOTION_DATA_TREE *this_sms;
  int square_index = 1;
  int nodes;

  aom_free(td->sms_tree);
  td->sms_tree =
      (SIMPLE_MOTION_DATA_TREE *)aom_calloc(tree_nodes, sizeof(*td->sms_tree));
  if (!td->sms_tree) return -1;
  this_sms = &td->sms_tree[0];

  if (!stat_generation_stage) {
    const int leaf_factor = is_sb_size_128 ? 4 : 1;
    const int leaf_nodes = 256 * leaf_factor;

    // Sets up all the leaf nodes in the tree.
    for (sms_tree_index = 0; sms_tree_index < leaf_nodes; ++sms_tree_index) {
      SIMPLE_MOTION_DATA_TREE *const tree = &td->sms_tree[sms_tree_index];
      tree->block_size = square[0];
    }

    // Each node has 4 leaf nodes, fill each block_size level of the tree
    // from leafs to the root.
    for (nodes = leaf_nodes >> 2; nodes > 0; nodes >>= 2) {
      for (int i = 0; i < nodes; ++i) {
        SIMPLE_MOTION_DATA_TREE *const tree = &td->sms_tree[sms_tree_index];
        tree->block_size = square[square_index];
        for (int j = 0; j < 4; j++) tree->split[j] = this_sms++;
        ++sms_tree_index;
      }
      ++square_index;
    }
  } else {
    // Allocation for firstpass/LAP stage
    // TODO(Mufaddal): refactor square_index to use a common block_size macro
    // from firstpass.c
    SIMPLE_MOTION_DATA_TREE *const tree = &td->sms_tree[sms_tree_index];
    square_index = 2;
    tree->block_size = square[square_index];
  }

  // Set up the root node for the largest superblock size
  td->sms_root = &td->sms_tree[tree_nodes - 1];
  return 0;
}